

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimizer.cpp
# Opt level: O0

void __thiscall spvtools::Optimizer::Optimizer(Optimizer *this,spv_target_env env)

{
  Impl *this_00;
  spv_target_env env_local;
  Optimizer *this_local;
  
  this_00 = (Impl *)::operator_new(0xa0);
  Impl::Impl(this_00,env);
  std::unique_ptr<spvtools::Optimizer::Impl,std::default_delete<spvtools::Optimizer::Impl>>::
  unique_ptr<std::default_delete<spvtools::Optimizer::Impl>,void>
            ((unique_ptr<spvtools::Optimizer::Impl,std::default_delete<spvtools::Optimizer::Impl>> *
             )this,this_00);
  if (env != SPV_ENV_WEBGPU_0) {
    return;
  }
  __assert_fail("env != SPV_ENV_WEBGPU_0",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/optimizer.cpp"
                ,0x4e,"spvtools::Optimizer::Optimizer(spv_target_env)");
}

Assistant:

Optimizer::Optimizer(spv_target_env env) : impl_(new Impl(env)) {
  assert(env != SPV_ENV_WEBGPU_0);
}